

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int getAutoVacuum(char *z)

{
  int iVar1;
  char *in_RDI;
  int i;
  uint local_18;
  uint local_4;
  
  iVar1 = sqlite3_stricmp(in_RDI,"none");
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = sqlite3_stricmp(in_RDI,"full");
    if (iVar1 == 0) {
      local_4 = 1;
    }
    else {
      iVar1 = sqlite3_stricmp(in_RDI,"incremental");
      if (iVar1 == 0) {
        local_4 = 2;
      }
      else {
        local_18 = sqlite3Atoi(in_RDI);
        if (((int)local_18 < 0) || (2 < (int)local_18)) {
          local_18 = 0;
        }
        local_4 = local_18 & 0xff;
      }
    }
  }
  return local_4;
}

Assistant:

static int getAutoVacuum(const char *z){
  int i;
  if( 0==sqlite3StrICmp(z, "none") ) return BTREE_AUTOVACUUM_NONE;
  if( 0==sqlite3StrICmp(z, "full") ) return BTREE_AUTOVACUUM_FULL;
  if( 0==sqlite3StrICmp(z, "incremental") ) return BTREE_AUTOVACUUM_INCR;
  i = sqlite3Atoi(z);
  return (u8)((i>=0&&i<=2)?i:0);
}